

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

void google::protobuf::compiler::cpp::ListAllFields
               (Descriptor *d,
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *fields)

{
  long lVar1;
  long lVar2;
  FieldDescriptor *local_30;
  
  if (0 < d->nested_type_count_) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      ListAllFields((Descriptor *)(&d->nested_types_->super_SymbolBase + lVar2),fields);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0xa0;
    } while (lVar1 < d->nested_type_count_);
  }
  if (0 < d->extension_count_) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      local_30 = (FieldDescriptor *)(&d->extensions_->super_SymbolBase + lVar1);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)fields,&local_30);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x58;
    } while (lVar2 < d->extension_count_);
  }
  if (0 < d->field_count_) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      local_30 = (FieldDescriptor *)(&d->fields_->super_SymbolBase + lVar1);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::emplace_back<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)fields,&local_30);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x58;
    } while (lVar2 < d->field_count_);
  }
  return;
}

Assistant:

void ListAllFields(const Descriptor* d,
                   std::vector<const FieldDescriptor*>* fields) {
  // Collect sub messages
  for (int i = 0; i < d->nested_type_count(); i++) {
    ListAllFields(d->nested_type(i), fields);
  }
  // Collect message level extensions.
  for (int i = 0; i < d->extension_count(); i++) {
    fields->push_back(d->extension(i));
  }
  // Add types of fields necessary
  for (int i = 0; i < d->field_count(); i++) {
    fields->push_back(d->field(i));
  }
}